

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

int UseHealthItems(TArray<AInventory_*,_AInventory_*> *Items,int *saveHealth)

{
  int *piVar1;
  AInventory *pAVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  
  uVar10 = Items->Count;
  iVar13 = *saveHealth;
  iVar12 = 0;
  if (0 < iVar13 && uVar10 != 0) {
    iVar12 = 0;
    do {
      uVar11 = 0xffffffff;
      uVar8 = 0;
      iVar3 = 0;
      do {
        iVar7 = iVar3;
        iVar9 = (Items->Array[uVar8]->super_AActor).health;
        iVar3 = iVar7;
        if (iVar7 < iVar9) {
          uVar11 = uVar8 & 0xffffffff;
          iVar3 = iVar9;
        }
        uVar8 = uVar8 + 1;
      } while (uVar10 + (uVar10 == 0) != uVar8);
      uVar8 = (long)(iVar13 + iVar3 + -1) / (long)iVar3;
      uVar5 = uVar8 & 0xffffffff;
      iVar13 = (int)uVar8;
      if (0 < iVar13) {
        uVar10 = (uint)uVar11;
        pAVar2 = Items->Array[(int)uVar10];
        iVar6 = iVar13 * iVar3 + iVar12;
        iVar13 = iVar12;
        if (iVar9 < iVar7) {
          iVar9 = iVar7;
        }
        do {
          iVar13 = iVar13 + iVar9;
          *saveHealth = *saveHealth - iVar3;
          piVar1 = &pAVar2->Amount;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (*(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
            iVar12 = iVar13;
            if (uVar10 < Items->Count) {
              uVar4 = Items->Count - 1;
              Items->Count = uVar4;
              if (uVar10 <= uVar4 && uVar4 - uVar10 != 0) {
                memmove(Items->Array + uVar11,Items->Array + (uVar10 + 1),
                        (ulong)(uVar4 - uVar10) << 3);
              }
            }
            break;
          }
          uVar4 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar4;
          iVar12 = iVar6;
        } while (uVar4 != 0);
      }
      uVar10 = Items->Count;
    } while ((uVar10 != 0) && (iVar13 = *saveHealth, 0 < iVar13));
  }
  return iVar12;
}

Assistant:

static int UseHealthItems(TArray<AInventory *> &Items, int &saveHealth)
{
	int saved = 0;

	while (Items.Size() > 0 && saveHealth > 0)
	{
		int maxhealth = 0;
		int index = -1;

		// Find the largest item in the list
		for(unsigned i = 0; i < Items.Size(); i++)
		{
			if (Items[i]->health > maxhealth)
			{
				index = i;
				maxhealth = Items[i]->health;
			}
		}

		// Now apply the health items, using the same logic as Heretic and Hexen.
		int count = (saveHealth + maxhealth-1) / maxhealth;
		for(int i = 0; i < count; i++)
		{
			saved += maxhealth;
			saveHealth -= maxhealth;
			if (--Items[index]->Amount == 0)
			{
				Items[index]->DepleteOrDestroy ();
				Items.Delete(index);
				break;
			}
		}
	}
	return saved;
}